

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip6.cpp
# Opt level: O2

void __thiscall clickhouse::ColumnIPv6::ColumnIPv6(ColumnIPv6 *this,ColumnRef *data)

{
  int iVar1;
  undefined4 extraout_var;
  runtime_error *this_00;
  TypeRef TStack_28;
  
  Type::CreateIPv6();
  Column::Column(&this->super_Column,&TStack_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&TStack_28.super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  (this->super_Column)._vptr_Column = (_func_int **)&PTR__ColumnIPv6_001862a0;
  Column::As<clickhouse::ColumnFixedString>((Column *)&this->data_);
  iVar1 = (*(((this->data_).
              super___shared_ptr<clickhouse::ColumnFixedString,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ->super_Column)._vptr_Column[6])();
  if (CONCAT44(extraout_var,iVar1) == 0) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_00,"number of entries must be even (two 64-bit numbers for each IPv6)");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

ColumnIPv6::ColumnIPv6(ColumnRef data)
    : Column(Type::CreateIPv6())
    , data_(data->As<ColumnFixedString>())
{
    if (data_->Size() != 0) {
        throw std::runtime_error("number of entries must be even (two 64-bit numbers for each IPv6)");
    }
}